

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

Vec_Ptr_t * Vec_PtrAllocArray(void **pArray,int nSize)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *p;
  int nSize_local;
  void **pArray_local;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nSize = nSize;
  pVVar1->nCap = nSize;
  pVVar1->pArray = pArray;
  return pVVar1;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrAllocArray( void ** pArray, int nSize )
{
    Vec_Ptr_t * p;
    p = ABC_ALLOC( Vec_Ptr_t, 1 );
    p->nSize  = nSize;
    p->nCap   = nSize;
    p->pArray = pArray;
    return p;
}